

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_binary_insertion_sort_start(int64_t *dst,size_t start,size_t size)

{
  int64_t x_00;
  ulong uVar1;
  size_t sVar2;
  ulong in_RDX;
  ulong in_RSI;
  int64_t *in_RDI;
  size_t location;
  int64_t x;
  size_t j;
  size_t i;
  ulong local_28;
  ulong local_20;
  
  local_20 = in_RSI;
  do {
    if (in_RDX <= local_20) {
      return;
    }
    if (0 < in_RDI[local_20 - 1] - in_RDI[local_20]) {
      x_00 = in_RDI[local_20];
      sVar2 = sorter_binary_insertion_find(in_RDI,x_00,local_20);
      uVar1 = local_20;
      do {
        local_28 = uVar1 - 1;
        if (local_28 < sVar2) break;
        in_RDI[uVar1] = in_RDI[local_28];
        uVar1 = local_28;
      } while (local_28 != 0);
      in_RDI[sVar2] = x_00;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start,
                                        const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze
     * in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}